

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BatchedMatMulLayerParams::CopyFrom
          (BatchedMatMulLayerParams *this,BatchedMatMulLayerParams *from)

{
  BatchedMatMulLayerParams *from_local;
  BatchedMatMulLayerParams *this_local;
  
  if (from != this) {
    Clear(this);
    MergeFrom(this,from);
  }
  return;
}

Assistant:

void BatchedMatMulLayerParams::CopyFrom(const BatchedMatMulLayerParams& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.BatchedMatMulLayerParams)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}